

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall spdlog::pattern_formatter::compile_pattern_(pattern_formatter *this,string *pattern)

{
  pointer puVar1;
  flag_formatter *pfVar2;
  aggregate_formatter *paVar3;
  const_iterator cVar4;
  pointer __p;
  pointer *__ptr_1;
  pointer puVar5;
  pointer *__ptr;
  pointer puVar6;
  char *pcVar7;
  const_iterator end;
  padding_info pVar8;
  padding_info padding;
  padding_info padding_00;
  aggregate_formatter *local_48;
  const_iterator local_40;
  _Head_base<0UL,_spdlog::details::flag_formatter_*,_false> local_38;
  
  pcVar7 = (pattern->_M_dataplus)._M_p;
  end._M_current = pcVar7 + pattern->_M_string_length;
  local_48 = (aggregate_formatter *)0x0;
  puVar1 = (this->formatters_).
           super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar5 = (this->formatters_).
           super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar6 = puVar1;
  if (puVar5 != puVar1) {
    do {
      pfVar2 = (puVar6->_M_t).
               super___uniq_ptr_impl<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
               ._M_t.
               super__Tuple_impl<0UL,_spdlog::details::flag_formatter_*,_std::default_delete<spdlog::details::flag_formatter>_>
               .super__Head_base<0UL,_spdlog::details::flag_formatter_*,_false>._M_head_impl;
      if (pfVar2 != (flag_formatter *)0x0) {
        (*pfVar2->_vptr_flag_formatter[1])();
      }
      (puVar6->_M_t).
      super___uniq_ptr_impl<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ._M_t.
      super__Tuple_impl<0UL,_spdlog::details::flag_formatter_*,_std::default_delete<spdlog::details::flag_formatter>_>
      .super__Head_base<0UL,_spdlog::details::flag_formatter_*,_false>._M_head_impl =
           (flag_formatter *)0x0;
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar5);
    (this->formatters_).
    super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1;
    pcVar7 = (pattern->_M_dataplus)._M_p;
  }
  if (pcVar7 != end._M_current) {
    do {
      paVar3 = local_48;
      local_40._M_current = pcVar7;
      if (*pcVar7 == '%') {
        if (local_48 != (aggregate_formatter *)0x0) {
          local_48 = (aggregate_formatter *)0x0;
          local_38._M_head_impl = &paVar3->super_flag_formatter;
          std::
          vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
          ::
          emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
                    ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                      *)&this->formatters_,
                     (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                      *)&local_38);
          if (local_38._M_head_impl != (flag_formatter *)0x0) {
            (*(local_38._M_head_impl)->_vptr_flag_formatter[1])();
          }
        }
        local_40._M_current = pcVar7 + 1;
        pVar8 = handle_padspec_(&local_40,end);
        cVar4._M_current = local_40._M_current;
        if (local_40._M_current == end._M_current) break;
        puVar5 = (pointer)((ulong)puVar5 & 0xffff000000000000 | pVar8._8_8_ & 0xffffffffffff);
        if ((pVar8._8_8_ >> 0x28 & 1) == 0) {
          padding._8_8_ = puVar5;
          padding.width_ = pVar8.width_;
          handle_flag_<spdlog::details::null_scoped_padder>(this,*local_40._M_current,padding);
          local_40._M_current = cVar4._M_current;
        }
        else {
          padding_00._8_8_ = puVar5;
          padding_00.width_ = pVar8.width_;
          handle_flag_<spdlog::details::scoped_padder>(this,*local_40._M_current,padding_00);
          local_40._M_current = cVar4._M_current;
        }
      }
      else {
        if (local_48 == (aggregate_formatter *)0x0) {
          local_48 = (aggregate_formatter *)operator_new(0x38);
          ((flag_formatter *)local_48)->_vptr_flag_formatter = (_func_int **)0x0;
          (((flag_formatter *)local_48)->padinfo_).width_ = 0;
          (((flag_formatter *)local_48)->padinfo_).side_ = left;
          (((flag_formatter *)local_48)->padinfo_).truncate_ = false;
          (((flag_formatter *)local_48)->padinfo_).enabled_ = false;
          *(undefined2 *)&(((flag_formatter *)local_48)->padinfo_).field_0xe = 0;
          ((flag_formatter *)((long)local_48 + 0x18))->_vptr_flag_formatter = (_func_int **)0x0;
          (((flag_formatter *)((long)local_48 + 0x18))->padinfo_).width_ = 0;
          (((flag_formatter *)((long)local_48 + 0x18))->padinfo_).side_ = left;
          (((flag_formatter *)((long)local_48 + 0x18))->padinfo_).truncate_ = false;
          (((flag_formatter *)((long)local_48 + 0x18))->padinfo_).enabled_ = false;
          *(undefined2 *)&(((flag_formatter *)((long)local_48 + 0x18))->padinfo_).field_0xe = 0;
          ((flag_formatter *)((long)local_48 + 0x30))->_vptr_flag_formatter = (_func_int **)0x0;
          ((flag_formatter *)local_48)->_vptr_flag_formatter =
               (_func_int **)&PTR__aggregate_formatter_001ebd90;
          ((flag_formatter *)((long)local_48 + 0x18))->_vptr_flag_formatter =
               (_func_int **)&(((flag_formatter *)((long)local_48 + 0x18))->padinfo_).side_;
        }
        std::__cxx11::string::push_back((char)local_48 + '\x18');
      }
      pcVar7 = local_40._M_current + 1;
    } while (pcVar7 != end._M_current);
    local_40._M_current = (char *)local_48;
    if (local_48 != (aggregate_formatter *)0x0) {
      local_48 = (aggregate_formatter *)0x0;
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
      ::
      emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
                ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                  *)&this->formatters_,
                 (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                  *)&local_40);
      if ((flag_formatter *)local_40._M_current != (flag_formatter *)0x0) {
        (**(code **)(*(long *)local_40._M_current + 8))();
      }
      if (local_48 != (aggregate_formatter *)0x0) {
        std::default_delete<spdlog::details::aggregate_formatter>::operator()
                  ((default_delete<spdlog::details::aggregate_formatter> *)&local_48,local_48);
      }
    }
  }
  return;
}

Assistant:

SPDLOG_INLINE void pattern_formatter::compile_pattern_(const std::string &pattern)
{
    auto end = pattern.end();
    std::unique_ptr<details::aggregate_formatter> user_chars;
    formatters_.clear();
    for (auto it = pattern.begin(); it != end; ++it)
    {
        if (*it == '%')
        {
            if (user_chars) // append user chars found so far
            {
                formatters_.push_back(std::move(user_chars));
            }

            auto padding = handle_padspec_(++it, end);

            if (it != end)
            {
                if (padding.enabled())
                {
                    handle_flag_<details::scoped_padder>(*it, padding);
                }
                else
                {
                    handle_flag_<details::null_scoped_padder>(*it, padding);
                }
            }
            else
            {
                break;
            }
        }
        else // chars not following the % sign should be displayed as is
        {
            if (!user_chars)
            {
                user_chars = details::make_unique<details::aggregate_formatter>();
            }
            user_chars->add_ch(*it);
        }
    }
    if (user_chars) // append raw chars found so far
    {
        formatters_.push_back(std::move(user_chars));
    }
}